

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::LossLayer::clear_LossLayerType(LossLayer *this)

{
  if (((this->_oneof_case_[0] == 0xb) || (this->_oneof_case_[0] == 10)) &&
     ((this->LossLayerType_).categoricalcrossentropylosslayer_ !=
      (CategoricalCrossEntropyLossLayer *)0x0)) {
    (*(((this->LossLayerType_).categoricalcrossentropylosslayer_)->super_MessageLite).
      _vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void LossLayer::clear_LossLayerType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.LossLayer)
  switch (LossLayerType_case()) {
    case kCategoricalCrossEntropyLossLayer: {
      delete LossLayerType_.categoricalcrossentropylosslayer_;
      break;
    }
    case kMeanSquaredErrorLossLayer: {
      delete LossLayerType_.meansquarederrorlosslayer_;
      break;
    }
    case LOSSLAYERTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = LOSSLAYERTYPE_NOT_SET;
}